

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::RALocalAllocator::makeInitialAssignment(RALocalAllocator *this)

{
  byte bVar1;
  long lVar2;
  undefined4 *puVar3;
  uint uVar4;
  bool bVar5;
  uint32_t uVar6;
  uint uVar7;
  Error EVar8;
  ArgPack *this_00;
  VirtReg *pVVar9;
  uint32_t *puVar10;
  RAAssignment *in_RDI;
  RAStackSlot *slot;
  uint32_t physId_1;
  uint32_t physId;
  RegMask allocableRegs;
  RegGroup group;
  uint32_t workId;
  RAWorkReg *workReg;
  VirtReg *virtReg;
  RegOnly *regArg;
  uint32_t valueIndex;
  uint32_t argIndex;
  uint32_t iter;
  uint32_t numIter;
  uint32_t argCount;
  ZoneBitVector *liveIn;
  RABlock *entry;
  FuncNode *func;
  undefined4 in_stack_fffffffffffffe28;
  uint32_t in_stack_fffffffffffffe2c;
  uint32_t in_stack_fffffffffffffe30;
  uint32_t in_stack_fffffffffffffe34;
  BaseRAPass *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  uint32_t in_stack_fffffffffffffe4c;
  uint in_stack_fffffffffffffe50;
  RegGroup group_00;
  uint in_stack_fffffffffffffe58;
  undefined4 uVar11;
  uint local_184;
  uint local_180;
  uint local_17c;
  uint local_178;
  uint local_d0;
  uint local_cc;
  undefined4 *local_c8;
  undefined4 *local_c0;
  undefined4 *local_b8;
  undefined4 *local_b0;
  uint local_a4;
  uint local_a0 [2];
  undefined4 *local_98;
  long local_90;
  long local_88;
  undefined4 local_7c;
  RegOnly *local_78;
  uint32_t local_6c;
  undefined4 *local_68;
  undefined4 *local_60;
  uint *local_58;
  undefined4 *local_50;
  undefined4 *local_48;
  undefined4 *local_40;
  undefined4 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_1c;
  uint *local_18;
  uint *local_10;
  uint *local_8;
  
  lVar2 = *(long *)(*(long *)&in_RDI->_layout + 0x98);
  BaseRAPass::entryBlock
            ((BaseRAPass *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_88 = lVar2 + 0x34;
  bVar1 = *(byte *)(lVar2 + 0xa8);
  local_178 = 1;
  local_17c = 0;
  do {
    if (local_178 <= local_17c) {
      return 0;
    }
    for (local_180 = 0; local_180 < bVar1; local_180 = local_180 + 1) {
      for (local_184 = 0; local_184 < 4; local_184 = local_184 + 1) {
        this_00 = FuncNode::argPack((FuncNode *)
                                    CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                    CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        local_78 = FuncNode::ArgPack::operator[](this_00,(ulong)local_184);
        local_7c = 0;
        if ((local_78->_signature)._bits != 0) {
          lVar2 = *(long *)&(in_RDI->_layout).physTotal;
          local_6c = local_78->_id;
          local_90 = lVar2 + 0x1e8;
          if (local_6c - 0x100 < *(uint *)(lVar2 + 0x1f0)) {
            pVVar9 = BaseCompiler::virtRegById
                               ((BaseCompiler *)
                                CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                in_stack_fffffffffffffe2c);
            puVar3 = *(undefined4 **)(pVVar9 + 0x28);
            if (puVar3 != (undefined4 *)0x0) {
              uVar11 = *puVar3;
              bVar5 = ZoneBitVector::bitAt((ZoneBitVector *)in_RDI,in_stack_fffffffffffffe34);
              if (bVar5) {
                local_68 = puVar3 + 8;
                in_stack_fffffffffffffe58 =
                     CONCAT13((char)((uint)*local_68 >> 8),(int3)in_stack_fffffffffffffe58) &
                     0xfffffff;
                local_60 = local_68;
                uVar6 = RAAssignment::workToPhysId
                                  (in_RDI,(RegGroup)(in_stack_fffffffffffffe34 >> 0x18),
                                   in_stack_fffffffffffffe30);
                if (uVar6 == 0xff) {
                  puVar10 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                                      ((RARegMask *)
                                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                                       ,(RegGroup *)
                                        CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28
                                                ));
                  in_stack_fffffffffffffe34 = *puVar10;
                  puVar10 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                                      ((RARegMask *)
                                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                                       ,(RegGroup *)
                                        CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28
                                                ));
                  uVar7 = in_stack_fffffffffffffe34 & (*puVar10 ^ 0xffffffff);
                  bVar5 = SUB41((uint)in_stack_fffffffffffffe48 >> 0x18,0);
                  group_00 = (RegGroup)(uVar7 >> 0x18);
                  if (local_17c == 0) {
                    if (*(char *)((long)puVar3 + 0x4a) != -1) {
                      in_stack_fffffffffffffe50 = (uint)*(byte *)((long)puVar3 + 0x4a);
                      local_58 = &local_d0;
                      local_d0 = in_stack_fffffffffffffe50;
                      local_cc = uVar7;
                      if ((uVar7 & 1 << (*(byte *)((long)puVar3 + 0x4a) & 0x1f)) != 0) {
                        RAAssignment::assign
                                  ((RAAssignment *)CONCAT44(uVar11,in_stack_fffffffffffffe58),
                                   group_00,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                                   bVar5);
                        local_50 = puVar3 + 8;
                        local_30 = *(undefined8 *)(puVar3 + 2);
                        local_c0 = puVar3;
                        local_b0 = puVar3;
                        local_38 = local_50;
                        FuncArgsAssignment::assignRegInPack
                                  ((FuncArgsAssignment *)CONCAT44(uVar11,in_stack_fffffffffffffe58),
                                   CONCAT44(uVar7,in_stack_fffffffffffffe50),
                                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                                   (RegType)((ulong)in_stack_fffffffffffffe40 >> 0x38),
                                   (uint32_t)in_stack_fffffffffffffe40,
                                   (TypeId)((ulong)in_RDI >> 0x38));
                        goto LAB_0014acd2;
                      }
                    }
                    local_178 = 2;
                  }
                  else if (uVar7 == 0) {
                    in_stack_fffffffffffffe40 =
                         (BaseRAPass *)
                         BaseRAPass::getOrCreateStackSlot
                                   (in_stack_fffffffffffffe40,(RAWorkReg *)in_RDI);
                    if (in_stack_fffffffffffffe40 == (BaseRAPass *)0x0) {
                      EVar8 = DebugUtils::errored(1);
                      return EVar8;
                    }
                    local_a0[1] = 0x400;
                    local_18 = puVar3 + 9;
                    local_1c = 0x400;
                    *local_18 = *local_18 | 0x400;
                    *(int *)(*(long *)&in_RDI->_layout + 0x430) =
                         *(int *)(*(long *)&in_RDI->_layout + 0x430) + 1;
                    local_98 = puVar3;
                  }
                  else {
                    local_10 = local_a0;
                    local_8 = &local_a4;
                    in_stack_fffffffffffffe4c = 0;
                    for (uVar4 = uVar7; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x80000000) {
                      in_stack_fffffffffffffe4c = in_stack_fffffffffffffe4c + 1;
                    }
                    local_a4 = uVar7;
                    local_a0[0] = uVar7;
                    RAAssignment::assign
                              ((RAAssignment *)CONCAT44(uVar11,in_stack_fffffffffffffe58),group_00,
                               in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,bVar5);
                    local_48 = puVar3 + 8;
                    local_28 = *(undefined8 *)(puVar3 + 2);
                    local_c8 = puVar3;
                    local_b8 = puVar3;
                    local_40 = local_48;
                    FuncArgsAssignment::assignRegInPack
                              ((FuncArgsAssignment *)CONCAT44(uVar11,in_stack_fffffffffffffe58),
                               CONCAT44(uVar7,in_stack_fffffffffffffe50),
                               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                               (RegType)((ulong)in_stack_fffffffffffffe40 >> 0x38),
                               (uint32_t)in_stack_fffffffffffffe40,(TypeId)((ulong)in_RDI >> 0x38));
                  }
                }
              }
            }
          }
        }
LAB_0014acd2:
      }
    }
    local_17c = local_17c + 1;
  } while( true );
}

Assistant:

Error RALocalAllocator::makeInitialAssignment() noexcept {
  FuncNode* func = _pass->func();
  RABlock* entry = _pass->entryBlock();

  ZoneBitVector& liveIn = entry->liveIn();
  uint32_t argCount = func->argCount();
  uint32_t numIter = 1;

  for (uint32_t iter = 0; iter < numIter; iter++) {
    for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
      for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
        // Unassigned argument.
        const RegOnly& regArg = func->argPack(argIndex)[valueIndex];
        if (!regArg.isReg() || !_cc->isVirtIdValid(regArg.id()))
          continue;

        VirtReg* virtReg = _cc->virtRegById(regArg.id());

        // Unreferenced argument.
        RAWorkReg* workReg = virtReg->workReg();
        if (!workReg)
          continue;

        // Overwritten argument.
        uint32_t workId = workReg->workId();
        if (!liveIn.bitAt(workId))
          continue;

        RegGroup group = workReg->group();
        if (_curAssignment.workToPhysId(group, workId) != RAAssignment::kPhysNone)
          continue;

        RegMask allocableRegs = _availableRegs[group] & ~_curAssignment.assigned(group);
        if (iter == 0) {
          // First iteration: Try to allocate to home RegId.
          if (workReg->hasHomeRegId()) {
            uint32_t physId = workReg->homeRegId();
            if (Support::bitTest(allocableRegs, physId)) {
              _curAssignment.assign(group, workId, physId, true);
              _pass->_argsAssignment.assignRegInPack(argIndex, valueIndex, workReg->type(), physId, workReg->typeId());
              continue;
            }
          }

          numIter = 2;
        }
        else {
          // Second iteration: Pick any other register if the is an unassigned one or assign to stack.
          if (allocableRegs) {
            uint32_t physId = Support::ctz(allocableRegs);
            _curAssignment.assign(group, workId, physId, true);
            _pass->_argsAssignment.assignRegInPack(argIndex, valueIndex, workReg->type(), physId, workReg->typeId());
          }
          else {
            // This register will definitely need stack, create the slot now and assign also `argIndex`
            // to it. We will patch `_argsAssignment` later after RAStackAllocator finishes.
            RAStackSlot* slot = _pass->getOrCreateStackSlot(workReg);
            if (ASMJIT_UNLIKELY(!slot))
              return DebugUtils::errored(kErrorOutOfMemory);

            // This means STACK_ARG may be moved to STACK.
            workReg->addFlags(RAWorkRegFlags::kStackArgToStack);
            _pass->_numStackArgsToStackSlots++;
          }
        }
      }
    }
  }

  return kErrorOk;
}